

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O0

bool __thiscall
wallet::BerkeleyROBatch::ReadKey(BerkeleyROBatch *this,DataStream *key,DataStream *value)

{
  iterator __first;
  iterator __last;
  const_iterator __n;
  DataStream *in_RDX;
  long in_FS_OFFSET;
  vector<std::byte,_zero_after_free_allocator<std::byte>_> val;
  const_iterator it;
  SerializeData key_data;
  DataStream *in_stack_ffffffffffffff18;
  DataStream *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  vector<std::byte,_zero_after_free_allocator<std::byte>_> *in_stack_ffffffffffffff48;
  bool local_71;
  int local_60;
  void *local_58;
  allocator_type local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __first = DataStream::begin((DataStream *)
                              CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  __last = DataStream::end(in_stack_ffffffffffffff20);
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::
  vector<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,zero_after_free_allocator<std::byte>>>,void>
            (in_stack_ffffffffffffff48,
             (__normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
              )__first._M_current,
             (__normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
              )__last._M_current,local_20);
  __n = std::
        map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
        ::find((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
                *)in_stack_ffffffffffffff20,&in_stack_ffffffffffffff18->vch);
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::end((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
         *)in_stack_ffffffffffffff20);
  local_71 = std::operator==((_Self *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                             (_Self *)in_stack_ffffffffffffff20);
  if (!local_71) {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>
                  *)in_stack_ffffffffffffff18);
    std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::vector
              (&in_RDX->vch,
               (vector<std::byte,_zero_after_free_allocator<std::byte>_> *)__first._M_current);
    DataStream::clear(in_stack_ffffffffffffff18);
    Span<std::byte>::Span<std::vector<std::byte,zero_after_free_allocator<std::byte>>>
              ((Span<std::byte> *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
               &in_stack_ffffffffffffff20->vch,in_stack_ffffffffffffff18);
    Span<const_std::byte>::Span<std::byte,_0>
              ((Span<const_std::byte> *)in_stack_ffffffffffffff18,(Span<std::byte> *)0xbd4803);
    DataStream::write(in_RDX,local_60,local_58,(size_t)__n._M_node);
    std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::~vector
              ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)
               CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  }
  local_71 = !local_71;
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::~vector
            ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)
             CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_71;
}

Assistant:

bool BerkeleyROBatch::ReadKey(DataStream&& key, DataStream& value)
{
    SerializeData key_data{key.begin(), key.end()};
    const auto it{m_database.m_records.find(key_data)};
    if (it == m_database.m_records.end()) {
        return false;
    }
    auto val = it->second;
    value.clear();
    value.write(Span(val));
    return true;
}